

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexicon.cpp
# Opt level: O1

void __thiscall Lexico::Token(Lexico *this,int final)

{
  uint uVar1;
  
  uVar1 = final - 3;
  if ((uVar1 < 0x2a) && ((0x20007ffffffU >> ((ulong)uVar1 & 0x3f) & 1) != 0)) {
    Tokens::setToken(&this->super_Tokens,*(int *)(&DAT_00104198 + (ulong)uVar1 * 4));
    return;
  }
  return;
}

Assistant:

void Lexico::Token (int final) {
	switch (final) {
		case 3 : Tokens::setToken (3) ; break;
		case 4 : Tokens::setToken (4) ; break;
    case 5 : Tokens::setToken (5) ; break;
    case 6 : Tokens::setToken (6) ; break;
		case 7 : Tokens::setToken (7) ; break;
		case 8 : Tokens::setToken (8) ; break;
		case 9 : Tokens::setToken (9) ; break;
		case 10: Tokens::setToken (10); break;
		case 11: Tokens::setToken (11); break;
    case 12: Tokens::setToken (12); break;
    case 13: Tokens::setToken (13); break;
    case 14: Tokens::setToken (14); break;
    case 15: Tokens::setToken (15); break;
    case 16: Tokens::setToken (16); break;
    case 17: Tokens::setToken (17); break;
    case 18: Tokens::setToken (18); break;
    case 19: Tokens::setToken (19); break;
    case 20: Tokens::setToken (20); break;
    case 21: Tokens::setToken (21); break;
    case 22: Tokens::setToken (22); break;
    case 23: Tokens::setToken (23); break;
    case 24: Tokens::setToken (24); break;
    case 25: Tokens::setToken (25); break;
    case 26: Tokens::setToken (26); break;
    case 27: Tokens::setToken (27); break;
    case 28: Tokens::setToken (28); break;
    case 29: Tokens::setToken (29); break;
    case UNDER: Tokens::setToken (2) ; break;
    case ABSOLUTE: break;
  }
}